

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O1

TPZTransform<double> *
pztopology::Pr<pztopology::TPZPoint>::SideToSideTransform
          (TPZTransform<double> *__return_storage_ptr__,int sidefrom,int sideto)

{
  int iVar1;
  int row;
  ostream *poVar2;
  long *plVar3;
  ulong uVar4;
  TPZStack<int,_10> highsides;
  TPZTransform<double> toelement;
  TPZTransform<double> toside;
  TPZManVector<int,_10> TStack_548;
  TPZTransform<double> local_500;
  TPZTransform<double> local_360;
  TPZTransform<double> local_1c0;
  
  if ((uint)sidefrom < 3 && (uint)sideto < 3) {
    if (sidefrom != sideto) {
      if (sidefrom == 2) {
        TransformElementToSide(__return_storage_ptr__,sideto);
        return __return_storage_ptr__;
      }
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&TStack_548);
      HigherDimensionSides(sidefrom,(TPZStack<int,_10> *)&TStack_548);
      if (0 < (int)(uint)TStack_548.super_TPZVec<int>.fNElements) {
        uVar4 = 0;
        do {
          if (TStack_548.super_TPZVec<int>.fStore[uVar4] == sideto) {
            iVar1 = SideDimension(sidefrom);
            row = SideDimension(sideto);
            TPZTransform<double>::TPZTransform(__return_storage_ptr__,row,iVar1);
            TPZTransform<double>::TPZTransform(&local_360,1,sidefrom);
            TPZTransform<double>::TPZTransform(&local_1c0,sideto,1);
            TransformSideToElement(&local_500,sidefrom);
            TPZTransform<double>::operator=(&local_360,&local_500);
            TPZTransform<double>::~TPZTransform(&local_500);
            TransformElementToSide(&local_500,sideto);
            TPZTransform<double>::operator=(&local_1c0,&local_500);
            TPZTransform<double>::~TPZTransform(&local_500);
            TPZTransform<double>::Multiply(&local_500,&local_1c0,&local_360);
            TPZTransform<double>::operator=(__return_storage_ptr__,&local_500);
            TPZTransform<double>::~TPZTransform(&local_500);
            TPZTransform<double>::~TPZTransform(&local_1c0);
            TPZTransform<double>::~TPZTransform(&local_360);
            goto LAB_00d9f460;
          }
          uVar4 = uVar4 + 1;
        } while (((uint)TStack_548.super_TPZVec<int>.fNElements & 0x7fffffff) != uVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Pr<TFather>::SideToSideTransform highside not found sidefrom ",0x3d);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,sidefrom);
      local_360.super_TPZSavable._vptr_TPZSavable._0_1_ = 0x20;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_360,1);
      plVar3 = (long *)std::ostream::operator<<(poVar2,sideto);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      TPZTransform<double>::TPZTransform(__return_storage_ptr__,0);
LAB_00d9f460:
      TPZManVector<int,_10>::~TPZManVector(&TStack_548);
      return __return_storage_ptr__;
    }
    iVar1 = SideDimension(sidefrom);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Pr<TFather>::HigherDimensionSides sidefrom ",0x2b);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,sidefrom);
    local_360.super_TPZSavable._vptr_TPZSavable._0_1_ = 0x20;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_360,1);
    plVar3 = (long *)std::ostream::operator<<(poVar2,sideto);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    iVar1 = 0;
  }
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,iVar1);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> Pr<TFather>::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "Pr<TFather>::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(SideDimension(sidefrom));
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
		TPZStack<int> highsides;
		HigherDimensionSides(sidefrom,highsides);
		int nhigh = highsides.NElements();
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[is] == sideto) {
				int dfr = SideDimension(sidefrom);
				int dto = SideDimension(sideto);
				TPZTransform<> trans(dto,dfr),toelement(Dimension,sidefrom),toside(sideto,Dimension);
				toelement = TransformSideToElement(sidefrom);
				toside = TransformElementToSide(sideto);
				trans = toside.Multiply(toelement);
				return trans;
			}
		}
		PZError << "Pr<TFather>::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}